

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.cpp
# Opt level: O1

void __thiscall MinVR::VRMain::renderOnAllDisplays(VRMain *this)

{
  runtime_error *this_00;
  pointer ppVVar1;
  iterator it;
  VRCompositeRenderHandler compositeHandler;
  VRDataIndex renderState;
  string local_118;
  long *local_f8 [2];
  long local_e8 [2];
  string local_d8;
  undefined1 local_b8 [152];
  
  if (this->_initialized != false) {
    VRDataIndex::VRDataIndex((VRDataIndex *)local_b8);
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"RenderState","");
    std::__cxx11::string::_M_assign((string *)(local_b8 + 0x38));
    if (local_f8[0] != local_e8) {
      operator_delete(local_f8[0],local_e8[0] + 1);
    }
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"InitRender","");
    VRDataIndex::addData(&local_d8,(VRDataIndex *)local_b8,&local_118,(uint)(this->_frame == 0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((this->_displayGraphs).
        super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->_displayGraphs).
        super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      VRCompositeRenderHandler::VRCompositeRenderHandler
                ((VRCompositeRenderHandler *)&local_118,&this->_renderHandlers);
      ppVVar1 = (this->_displayGraphs).
                super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppVVar1 !=
          (this->_displayGraphs).
          super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          (*(*ppVVar1)->_vptr_VRDisplayNode[4])(*ppVVar1,local_b8,&local_118);
          ppVVar1 = ppVVar1 + 1;
        } while (ppVVar1 !=
                 (this->_displayGraphs).
                 super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      ppVVar1 = (this->_displayGraphs).
                super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppVVar1 !=
          (this->_displayGraphs).
          super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          (*(*ppVVar1)->_vptr_VRDisplayNode[5])(*ppVVar1,local_b8);
          ppVVar1 = ppVVar1 + 1;
        } while (ppVVar1 !=
                 (this->_displayGraphs).
                 super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_118._M_dataplus._M_p = (pointer)&PTR_onVRRenderScene_00176338;
      if ((void *)local_118._M_string_length != (void *)0x0) {
        operator_delete((void *)local_118._M_string_length,
                        local_118.field_2._8_8_ - local_118._M_string_length);
      }
    }
    if (this->_net != (VRNetInterface *)0x0) {
      (*this->_net->_vptr_VRNetInterface[1])();
    }
    ppVVar1 = (this->_displayGraphs).
              super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppVVar1 !=
        (this->_displayGraphs).
        super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        (*(*ppVVar1)->_vptr_VRDisplayNode[6])(*ppVVar1,local_b8);
        ppVVar1 = ppVVar1 + 1;
      } while (ppVVar1 !=
               (this->_displayGraphs).
               super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    this->_frame = this->_frame + 1;
    VRDataIndex::~VRDataIndex((VRDataIndex *)local_b8);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"VRMain not initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VRMain::renderOnAllDisplays() {

  if (!_initialized) throw std::runtime_error("VRMain not initialized.");

	VRDataIndex renderState;
  renderState.setName("RenderState");
	renderState.addData("InitRender", (int)(_frame == 0));

	if (!_displayGraphs.empty()) {
		VRCompositeRenderHandler compositeHandler(_renderHandlers);
		for (std::vector<VRDisplayNode*>::iterator it = _displayGraphs.begin(); it != _displayGraphs.end(); ++it) (*it)->render(&renderState, &compositeHandler);

		// TODO: Advanced: if you are really trying to optimize performance, this
		// is where you might want to add an idle callback.  Here, it's
		// possible that the CPU is idle, but the GPU is still processing
		// graphics comamnds.

		for (std::vector<VRDisplayNode*>::iterator it = _displayGraphs.begin(); it != _displayGraphs.end(); ++it) (*it)->waitForRenderToComplete(&renderState);
	}

	// SYNCHRONIZATION POINT #2: When this function returns we know that
	// all nodes have finished rendering on all their attached display
	// devices.  So, after this, we will be ready to "swap buffers",
	// simultaneously displaying these new renderings on all nodes.
	if (_net != NULL) {
		_net->syncSwapBuffersAcrossAllNodes();
	}

	if (!_displayGraphs.empty()) {
		for (std::vector<VRDisplayNode*>::iterator it = _displayGraphs.begin(); it != _displayGraphs.end(); ++it) (*it)->displayFinishedRendering(&renderState);
	}

	_frame++;
}